

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_hasUnlinkedUnitsInDeepComponentHierarchy_Test::
~Units_hasUnlinkedUnitsInDeepComponentHierarchy_Test
          (Units_hasUnlinkedUnitsInDeepComponentHierarchy_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, hasUnlinkedUnitsInDeepComponentHierarchy)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();

    libcellml::UnitsPtr u = libcellml::Units::create();

    model->setName("model");
    u->setName("my_units");
    model->addUnits(u);

    c1->setName("c1");
    c2->setName("c2");
    c3->setName("c3");

    model->addComponent(c1);
    c1->addComponent(c2);
    c2->addComponent(c3);

    c3->addVariable(createVariableWithUnits("v", "my_units"));

    EXPECT_TRUE(model->hasUnlinkedUnits());

    model->linkUnits();
    EXPECT_FALSE(model->hasUnlinkedUnits());
}